

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O3

void __thiscall
cfd::js::api::json::GetAddressesFromMultisigRequest::ConvertFromStruct
          (GetAddressesFromMultisigRequest *this,GetAddressesFromMultisigRequestStruct *data)

{
  this->is_elements_ = data->is_elements;
  std::__cxx11::string::_M_assign((string *)&this->redeem_script_);
  std::__cxx11::string::_M_assign((string *)&this->network_);
  std::__cxx11::string::_M_assign((string *)&this->hash_type_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void GetAddressesFromMultisigRequest::ConvertFromStruct(
    const GetAddressesFromMultisigRequestStruct& data) {
  is_elements_ = data.is_elements;
  redeem_script_ = data.redeem_script;
  network_ = data.network;
  hash_type_ = data.hash_type;
  ignore_items = data.ignore_items;
}